

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  TestInfo *this_00;
  char *pcVar6;
  ExecDeathTest *this_01;
  NoExecDeathTest *this_02;
  int __c;
  int __c_00;
  int __c_01;
  String *in_stack_ffffffffffffff20;
  String *this_03;
  String local_98;
  InternalRunDeathTestFlag local_88;
  String local_68;
  uint local_54;
  InternalRunDeathTestFlag *pIStack_50;
  int death_test_index;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  DeathTest **test_local;
  char *pcStack_30;
  int line_local;
  char *file_local;
  RE *regex_local;
  char *statement_local;
  DefaultDeathTestFactory *this_local;
  
  impl = (UnitTestImpl *)test;
  test_local._4_4_ = line;
  pcStack_30 = file;
  file_local = (char *)regex;
  regex_local = (RE *)statement;
  statement_local = (char *)this;
  flag = (InternalRunDeathTestFlag *)GetUnitTestImpl();
  pIStack_50 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)flag);
  this_00 = UnitTestImpl::current_test_info((UnitTestImpl *)flag);
  uVar4 = TestInfo::increment_death_test_count(this_00);
  local_54 = uVar4;
  if (pIStack_50 != (InternalRunDeathTestFlag *)0x0) {
    pcVar6 = InternalRunDeathTestFlag::index(pIStack_50,statement,__c);
    uVar1 = local_54;
    if ((int)pcVar6 < (int)uVar4) {
      pcVar6 = InternalRunDeathTestFlag::index(pIStack_50,statement,__c_00);
      String::Format(&local_68,"Death test count (%d) somehow exceeded expected maximum (%d)",
                     (ulong)uVar1,(ulong)pcVar6 & 0xffffffff);
      DeathTest::set_last_death_test_message(&local_68);
      String::~String(in_stack_ffffffffffffff20);
      return false;
    }
    InternalRunDeathTestFlag::file(&local_88);
    pcVar6 = pcStack_30;
    bVar2 = String::operator==(&local_88.file_,pcStack_30);
    bVar3 = false;
    if (bVar2) {
      iVar5 = InternalRunDeathTestFlag::line(pIStack_50);
      bVar3 = false;
      if (iVar5 == test_local._4_4_) {
        pcVar6 = InternalRunDeathTestFlag::index(pIStack_50,pcVar6,__c_01);
        bVar3 = (uint)pcVar6 == local_54;
      }
    }
    String::~String(in_stack_ffffffffffffff20);
    if (!bVar3) {
      impl->_vptr_UnitTestImpl = (_func_int **)0x0;
      return true;
    }
  }
  bVar3 = String::operator==((String *)FLAGS_gtest_death_test_style,"threadsafe");
  if (bVar3) {
    this_01 = (ExecDeathTest *)operator_new(0x40);
    ExecDeathTest::ExecDeathTest
              (this_01,(char *)regex_local,(RE *)file_local,pcStack_30,test_local._4_4_);
    impl->_vptr_UnitTestImpl = (_func_int **)this_01;
  }
  else {
    bVar3 = String::operator==((String *)FLAGS_gtest_death_test_style,"fast");
    if (!bVar3) {
      pcVar6 = String::c_str((String *)FLAGS_gtest_death_test_style);
      this_03 = &local_98;
      String::Format(this_03,"Unknown death test style \"%s\" encountered",pcVar6);
      DeathTest::set_last_death_test_message(this_03);
      String::~String(this_03);
      return false;
    }
    this_02 = (NoExecDeathTest *)operator_new(0x30);
    NoExecDeathTest::NoExecDeathTest(this_02,(char *)regex_local,(RE *)file_local);
    impl->_vptr_UnitTestImpl = (_func_int **)this_02;
  }
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(String::Format(
          "Death test count (%d) somehow exceeded expected maximum (%d)",
          death_test_index, flag->index()));
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(String::Format(
        "Unknown death test style \"%s\" encountered",
        GTEST_FLAG(death_test_style).c_str()));
    return false;
  }